

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O1

void slang::SFormat::formatInt(string *result,SVInt *value,LiteralBase base,FormatOptions *options)

{
  char *pcVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  double dVar4;
  SVInt copy;
  SmallVector<char,_40UL> buffer;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_78;
  uint local_70;
  undefined1 local_6c;
  byte local_6b;
  SmallVectorBase<char> local_68 [2];
  
  pcVar1 = local_68[0].firstElement;
  local_68[0].len = 0;
  local_68[0].cap = 0x28;
  local_68[0].data_ = pcVar1;
  if (((int)CONCAT71(in_register_00000011,base) == 2) ||
     ((value->super_SVIntStorage).signFlag != true)) {
    SVInt::writeTo(value,local_68,base,false,0xffffff);
  }
  else {
    SVInt::SVInt((SVInt *)&local_78,&value->super_SVIntStorage);
    local_6c = 0;
    SVInt::writeTo((SVInt *)&local_78,local_68,base,false,0xffffff);
    if (((0x40 < local_70) || ((local_6b & 1) != 0)) && ((void *)local_78.val != (void *)0x0)) {
      operator_delete__(local_78.pVal);
    }
  }
  if ((options->width).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    uVar2 = (options->width).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value;
    goto switchD_0034d5b5_caseD_0;
  }
  if (Hex < base) {
    uVar2 = 0;
    goto switchD_0034d5b5_caseD_0;
  }
  uVar2 = (value->super_SVIntStorage).bitWidth;
  switch(base) {
  case Binary:
    goto switchD_0034d5b5_caseD_0;
  case Octal:
    dVar4 = (double)uVar2 / 3.0;
    break;
  case Decimal:
    dVar4 = ceil((double)uVar2 / 3.321928094887362);
    uVar2 = (uint)(value->super_SVIntStorage).signFlag + (int)(long)dVar4;
    goto switchD_0034d5b5_caseD_0;
  case Hex:
    dVar4 = (double)uVar2 * 0.25;
  }
  dVar4 = ceil(dVar4);
  uVar2 = (uint)(long)dVar4;
switchD_0034d5b5_caseD_0:
  uVar3 = (ulong)uVar2;
  if ((local_68[0].len <= uVar3 && uVar3 - local_68[0].len != 0) && (options->leftJustify == false))
  {
    std::__cxx11::string::_M_replace_aux
              ((ulong)result,result->_M_string_length,0,(char)(uVar3 - local_68[0].len));
  }
  std::__cxx11::string::replace
            ((ulong)result,result->_M_string_length,(char *)0x0,(ulong)local_68[0].data_);
  if ((local_68[0].len <= uVar3 && uVar3 - local_68[0].len != 0) && (options->leftJustify == true))
  {
    std::__cxx11::string::_M_replace_aux
              ((ulong)result,result->_M_string_length,0,(char)(uVar3 - local_68[0].len));
  }
  if (local_68[0].data_ != pcVar1) {
    free(local_68[0].data_);
  }
  return;
}

Assistant:

void formatInt(std::string& result, const SVInt& value, LiteralBase base,
               const FormatOptions& options) {
    SmallVector<char> buffer;
    if (base != LiteralBase::Decimal && value.isSigned()) {
        // Non-decimal bases don't print as signed ever.
        SVInt copy = value;
        copy.setSigned(false);
        copy.writeTo(buffer, base, /* includeBase */ false);
    }
    else {
        value.writeTo(buffer, base, /* includeBase */ false);
    }

    // If no width is specified we need to calculate it ourselves based on the bitwidth
    // of the provided integer.
    uint32_t width = 0;
    if (options.width)
        width = *options.width;
    else {
        bitwidth_t bw = value.getBitWidth();
        switch (base) {
            case LiteralBase::Binary:
                width = bw;
                break;
            case LiteralBase::Octal:
                width = uint32_t(ceil(bw / 3.0));
                break;
            case LiteralBase::Hex:
                width = uint32_t(ceil(bw / 4.0));
                break;
            case LiteralBase::Decimal:
                width = uint32_t(ceil(bw / log2_10));
                if (value.isSigned())
                    width++;
                break;
        }
    }

    auto doPad = [&] {
        char pad = '0';
        if (base == LiteralBase::Decimal)
            pad = ' ';

        result.append(width - buffer.size(), pad);
    };

    if (buffer.size() < width && !options.leftJustify)
        doPad();

    result.append(buffer.begin(), buffer.end());

    if (buffer.size() < width && options.leftJustify)
        doPad();
}